

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

int __thiscall soplex::SPxSteepPR<double>::selectLeave(SPxSteepPR<double> *this)

{
  double tol;
  SPxSolverBase<double> *pSVar1;
  SPxOut *pSVar2;
  uint uVar3;
  Verbosity old_verbosity;
  Verbosity local_1c;
  
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  if ((pSVar1->hyperPricingLeave == true) && ((pSVar1->sparsePricingLeave & 1U) != 0)) {
    if (((this->bestPrices).super_IdxSet.num < 2) ||
       ((pSVar1->super_SPxBasisBase<double>).updateCount == 0)) {
      uVar3 = buildBestPriceVectorLeave(this,(this->super_SPxPricer<double>).thetolerance);
    }
    else {
      uVar3 = selectLeaveHyper(this,(this->super_SPxPricer<double>).thetolerance);
    }
  }
  else {
    tol = (this->super_SPxPricer<double>).thetolerance;
    if ((pSVar1->sparsePricingLeave & 1U) == 0) {
      uVar3 = selectLeaveX(this,tol);
    }
    else {
      uVar3 = selectLeaveSparse(this,tol);
    }
  }
  if ((int)uVar3 < 0) {
    if (this->refined != false) {
      return uVar3;
    }
    this->refined = true;
    pSVar2 = ((this->super_SPxPricer<double>).thesolver)->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
      local_1c = pSVar2->m_verbosity;
      (*pSVar2->_vptr_SPxOut[2])();
      soplex::operator<<(((this->super_SPxPricer<double>).thesolver)->spxout,
                         "WSTEEP03 trying refinement step..\n");
      pSVar2 = ((this->super_SPxPricer<double>).thesolver)->spxout;
      (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_1c);
    }
    uVar3 = selectLeaveX(this,(this->super_SPxPricer<double>).thetolerance * 0.5);
    if ((int)uVar3 < 0) {
      return uVar3;
    }
  }
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  SPxBasisBase<double>::coSolve
            (&pSVar1->super_SPxBasisBase<double>,&pSVar1->theCoPvec->thedelta,
             &(pSVar1->unitVecs).data.
              super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar3].super_SVectorBase<double>);
  SSVectorBase<double>::setup_and_assign<double>
            (&this->workRhs,&((this->super_SPxPricer<double>).thesolver)->theCoPvec->thedelta);
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  pSVar1->solveVector2 = &this->workVec;
  pSVar1->solveVector2rhs = &this->workRhs;
  return uVar3;
}

Assistant:

int SPxSteepPR<R>::selectLeave()
{
   assert(isConsistent());

   int retid;

   if(this->thesolver->hyperPricingLeave && this->thesolver->sparsePricingLeave)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
      {
         // call init method to build up price-vector and return index of largest price
         retid = buildBestPriceVectorLeave(this->thetolerance);
      }
      else
         retid = selectLeaveHyper(this->thetolerance);
   }
   else if(this->thesolver->sparsePricingLeave)
      retid = selectLeaveSparse(this->thetolerance);
   else
      retid = selectLeaveX(this->thetolerance);

   if(retid < 0 && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WSTEEP03 trying refinement step..\n";)
      retid = selectLeaveX(this->thetolerance / SOPLEX_STEEP_REFINETOL);
   }

   if(retid >= 0)
   {
      assert(this->thesolver->coPvec().delta().isConsistent());
      // coPvec().delta() might be not setup after the solve when it contains too many nonzeros.
      // This is intended and forcing to keep the sparsity information leads to a slowdown
      // TODO implement a dedicated solve method for unitvectors
      this->thesolver->basis().coSolve(this->thesolver->coPvec().delta(),
                                       this->thesolver->unitVector(retid));
      assert(this->thesolver->coPvec().delta().isConsistent());
      workRhs.setup_and_assign(this->thesolver->coPvec().delta());
      this->thesolver->setup4solve(&workVec, &workRhs);
   }

   return retid;
}